

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_compare(sexp ctx,sexp a,sexp b)

{
  double dVar1;
  char cVar2;
  sexp_tag_t sVar3;
  uint uVar4;
  sexp psVar5;
  sexp_sint_t sVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  char *msg;
  long lVar10;
  double dVar11;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_40;
  sexp_gc_var_t local_38;
  
  if (((ulong)a & 3) == 0) {
    uVar4 = 0;
    if ((ulong)a->tag < 0x11) {
      uVar4 = sexp_number_types[a->tag];
    }
  }
  else {
    uVar4 = (uint)a & 1;
  }
  if (((ulong)b & 3) == 0) {
    uVar9 = 0;
    if ((ulong)b->tag < 0x11) {
      uVar9 = sexp_number_types[b->tag];
    }
  }
  else {
    uVar9 = (uint)b & 1;
  }
  local_38.var = &local_40;
  local_40 = (sexp)&DAT_0000043e;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  if ((int)uVar9 < (int)uVar4) {
    psVar5 = sexp_compare(ctx,b,a);
    if (((ulong)psVar5 & 3) == 0) {
      sVar3 = psVar5->tag;
      if (sVar3 == 0x13) goto LAB_0011c38e;
      if (sVar3 == 0xc) {
        (psVar5->value).flonum_bits[0] = -(psVar5->value).flonum_bits[0];
        goto LAB_0011c38e;
      }
      if (sVar3 == 0xb) {
        (psVar5->value).stack.length = (psVar5->value).stack.length ^ 0x8000000000000000;
        goto LAB_0011c38e;
      }
    }
    if (((ulong)psVar5 & 1) != 0) {
      psVar5 = (sexp)(1 - ((ulong)psVar5 & 0xfffffffffffffffe));
    }
    goto LAB_0011c38e;
  }
  switch(uVar9 + uVar4 * 6) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 0xb:
  case 0x11:
  case 0x17:
  case 0x1d:
  case 0x23:
    psVar5 = sexp_type_exception(ctx,(sexp)0x0,3,a);
    goto LAB_0011c38e;
  default:
    msg = "unknown comparison";
    b = a;
    break;
  case 7:
    lVar10 = -((ulong)b & 0xfffffffffffffffe);
    goto LAB_0011c210;
  case 8:
    dVar11 = (b->value).flonum;
    if (ABS(dVar11) == INFINITY) {
      uVar7 = (ulong)(dVar11 <= 0.0);
LAB_0011c32e:
      psVar5 = (sexp)(uVar7 * 4 + -1);
      goto LAB_0011c38e;
    }
    if (!NAN(dVar11)) {
      b = sexp_inexact_to_exact(ctx,(sexp)0x0,1,b);
      local_40 = b;
LAB_0011c386:
      psVar5 = sexp_compare(ctx,a,b);
      goto LAB_0011c38e;
    }
    goto LAB_0011c3c0;
  case 9:
    uVar7 = (b->value).string.offset;
    do {
      uVar8 = uVar7;
      if (uVar8 == 1) {
        uVar8 = 1;
        break;
      }
      uVar7 = uVar8 - 1;
    } while (*(long *)((long)&b->value + uVar8 * 8 + 8) == 0);
    if ((1 < uVar8) || (uVar7 = (b->value).string.length, uVar7 >> 0x3e != 0)) {
      uVar7 = (ulong)((b->value).flonum_bits[0] < '\0');
      goto LAB_0011c32e;
    }
    lVar10 = uVar7 * -2;
LAB_0011c210:
    psVar5 = (sexp)((long)&a->tag + lVar10 | 1);
    goto LAB_0011c38e;
  case 10:
  case 0x16:
    a = sexp_make_ratio(ctx,a,(sexp)&DAT_00000003);
    local_40 = a;
  case 0x1c:
    psVar5 = sexp_ratio_compare(ctx,a,b);
    goto LAB_0011c38e;
  case 0xe:
    dVar11 = (a->value).flonum;
    if (NAN(dVar11)) goto LAB_0011c3b4;
    dVar1 = (b->value).flonum;
    if (!NAN(dVar1)) {
      psVar5 = (sexp)&DAT_ffffffffffffffff;
      if (dVar1 <= dVar11) {
        psVar5 = (sexp)((ulong)(-(uint)(dVar11 != dVar1) & 1) * 2 + 1);
      }
      goto LAB_0011c38e;
    }
LAB_0011c3c0:
    msg = "can\'t compare NaN";
    break;
  case 0xf:
    dVar11 = (a->value).flonum;
    if (ABS(dVar11) == INFINITY) {
LAB_0011c261:
      uVar7 = (ulong)(0.0 < dVar11);
      goto LAB_0011c32e;
    }
    if (NAN(dVar11)) goto LAB_0011c3b4;
    a = sexp_double_to_bignum(ctx,dVar11);
    local_40 = a;
  case 0x15:
    cVar2 = (a->value).flonum_bits[0];
    lVar10 = (long)cVar2;
    if (cVar2 == (b->value).flonum_bits[0]) {
      sVar6 = sexp_bignum_compare_abs(a,b);
      lVar10 = -sVar6;
      if (-1 < cVar2) {
        lVar10 = sVar6;
      }
    }
    psVar5 = (sexp)(lVar10 * 2 + 1);
    goto LAB_0011c38e;
  case 0x10:
    dVar11 = (a->value).flonum;
    if (ABS(dVar11) == INFINITY) goto LAB_0011c261;
    if (!NAN(dVar11)) {
      a = sexp_inexact_to_exact(ctx,(sexp)0x0,1,a);
      local_40 = a;
      goto LAB_0011c386;
    }
LAB_0011c3b4:
    msg = "can\'t compare NaN";
    b = a;
  }
  psVar5 = sexp_xtype_exception(ctx,(sexp)0x0,msg,b);
LAB_0011c38e:
  (ctx->value).context.saves = local_38.next;
  return psVar5;
}

Assistant:

sexp sexp_compare (sexp ctx, sexp a, sexp b) {
  int at=sexp_number_type(a), bt=sexp_number_type(b);
  sexp r=SEXP_VOID;
  double f, g;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if (at > bt) {
    r = sexp_compare(ctx, b, a);
    if (!sexp_exceptionp(r)) { sexp_negate(r); }
  } else {
    switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
    case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
    case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_COMPLEX
    case SEXP_NUM_CPX_CPX: case SEXP_NUM_FIX_CPX:
    case SEXP_NUM_FLO_CPX: case SEXP_NUM_BIG_CPX:
#if SEXP_USE_RATIOS
    case SEXP_NUM_RAT_CPX:
#endif
#endif
      r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
      break;
    case SEXP_NUM_FIX_FIX:
      r = sexp_make_fixnum(sexp_unbox_fixnum(a) - sexp_unbox_fixnum(b));
      break;
    case SEXP_NUM_FIX_FLO:
      if (isinf(sexp_flonum_value(b))) {
        r = sexp_flonum_value(b) > 0 ? SEXP_NEG_ONE : SEXP_ONE;
      } else if (isnan(sexp_flonum_value(b))) {
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", b);
      } else {
        r = sexp_compare(ctx, a, tmp=sexp_inexact_to_exact(ctx, NULL, 1, b));
      }
      break;
    case SEXP_NUM_FIX_BIG:
      if ((sexp_bignum_hi(b) > 1) ||
          (sexp_bignum_data(b)[0] > SEXP_MAX_FIXNUM))
        r = sexp_make_fixnum(sexp_bignum_sign(b) < 0 ? 1 : -1);
      else
        r = sexp_make_fixnum(sexp_unbox_fixnum(a) - (sexp_sint_t)sexp_bignum_data(b)[0]);
      break;
    case SEXP_NUM_FLO_FLO:
      f = sexp_flonum_value(a);
      g = sexp_flonum_value(b);
      if (isnan(f))
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", a);
      else if (isnan(g))
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", b);
      else
        r = sexp_make_fixnum(f < g ? -1 : f == g ? 0 : 1);
      break;
    case SEXP_NUM_FLO_BIG:
      f = sexp_flonum_value(a);
      if (isinf(f)) {
        r = f > 0 ? SEXP_ONE : SEXP_NEG_ONE;
        break;
      } else if (isnan(f)) {
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", a);
        break;
      } else {
        a = tmp = sexp_double_to_bignum(ctx, f);
      }
      /* ... FALLTHROUGH ... */
    case SEXP_NUM_BIG_BIG:
      r = sexp_make_fixnum(sexp_bignum_compare(a, b));
      break;
#if SEXP_USE_RATIOS
    case SEXP_NUM_FLO_RAT:
      f = sexp_flonum_value(a);
      if (isinf(f)) {
        r = f > 0 ? SEXP_ONE : SEXP_NEG_ONE;
      } else if (isnan(f)) {
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", a);
      } else {
        r = sexp_compare(ctx, tmp=sexp_inexact_to_exact(ctx, NULL, 1, a), b);
      }
      break;
    case SEXP_NUM_FIX_RAT:
    case SEXP_NUM_BIG_RAT:
      a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
      /* ... FALLTHROUGH ... */
    case SEXP_NUM_RAT_RAT:
      r = sexp_ratio_compare(ctx, a, b);
      break;
#endif
    default:
      r = sexp_xtype_exception(ctx, NULL, "unknown comparison", a);
      break;
    }
  }
  sexp_gc_release1(ctx);
  return r;
}